

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

spv_result_t __thiscall
anon_unknown.dwarf_50d37b::Parser::setNumericTypeInfoForType
          (Parser *this,spv_parsed_operand_t *parsed_operand,uint32_t type_id)

{
  bool bVar1;
  pointer ppVar2;
  DiagnosticStream *pDVar3;
  DiagnosticStream local_3f0;
  NumberType *local_218;
  NumberType *info;
  _Node_iterator_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
  local_38;
  _Node_iterator_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
  local_30;
  iterator type_info_iter;
  uint32_t type_id_local;
  spv_parsed_operand_t *parsed_operand_local;
  Parser *this_local;
  
  type_info_iter.
  super__Node_iterator_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
  ._M_cur._4_4_ = type_id;
  if (type_id != 0) {
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_(anonymous_namespace)::Parser::NumberType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>_>
         ::find(&(this->_).type_id_to_number_type_info,
                (key_type *)
                ((long)&type_info_iter.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                        ._M_cur + 4));
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_(anonymous_namespace)::Parser::NumberType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>_>
         ::end(&(this->_).type_id_to_number_type_info);
    bVar1 = std::__detail::operator==(&local_30,&local_38);
    if (bVar1) {
      diagnostic((DiagnosticStream *)&info,this);
      pDVar3 = spvtools::DiagnosticStream::operator<<
                         ((DiagnosticStream *)&info,(char (*) [9])"Type Id ");
      pDVar3 = spvtools::DiagnosticStream::operator<<
                         (pDVar3,(uint *)((long)&type_info_iter.
                                                 super__Node_iterator_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                                                 ._M_cur + 4));
      pDVar3 = spvtools::DiagnosticStream::operator<<(pDVar3,(char (*) [15])" is not a type");
      this_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&info);
    }
    else {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false,_false>
                             *)&local_30);
      local_218 = &ppVar2->second;
      if (local_218->type == SPV_NUMBER_NONE) {
        diagnostic(&local_3f0,this);
        pDVar3 = spvtools::DiagnosticStream::operator<<(&local_3f0,(char (*) [9])"Type Id ");
        pDVar3 = spvtools::DiagnosticStream::operator<<
                           (pDVar3,(uint *)((long)&type_info_iter.
                                                                                                      
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                                                  ._M_cur + 4));
        pDVar3 = spvtools::DiagnosticStream::operator<<
                           (pDVar3,(char (*) [30])" is not a scalar numeric type");
        this_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
        spvtools::DiagnosticStream::~DiagnosticStream(&local_3f0);
      }
      else {
        parsed_operand->number_kind = local_218->type;
        parsed_operand->number_bit_width = (ppVar2->second).bit_width;
        parsed_operand->num_words = (uint16_t)((ppVar2->second).bit_width + 0x1f >> 5);
        this_local._4_4_ = SPV_SUCCESS;
      }
    }
    return this_local._4_4_;
  }
  __assert_fail("type_id != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/binary.cpp"
                ,0x327,
                "spv_result_t (anonymous namespace)::Parser::setNumericTypeInfoForType(spv_parsed_operand_t *, uint32_t)"
               );
}

Assistant:

spv_result_t Parser::setNumericTypeInfoForType(
    spv_parsed_operand_t* parsed_operand, uint32_t type_id) {
  assert(type_id != 0);
  auto type_info_iter = _.type_id_to_number_type_info.find(type_id);
  if (type_info_iter == _.type_id_to_number_type_info.end()) {
    return diagnostic() << "Type Id " << type_id << " is not a type";
  }
  const NumberType& info = type_info_iter->second;
  if (info.type == SPV_NUMBER_NONE) {
    // This is a valid type, but for something other than a scalar number.
    return diagnostic() << "Type Id " << type_id
                        << " is not a scalar numeric type";
  }

  parsed_operand->number_kind = info.type;
  parsed_operand->number_bit_width = info.bit_width;
  // Round up the word count.
  parsed_operand->num_words = static_cast<uint16_t>((info.bit_width + 31) / 32);
  return SPV_SUCCESS;
}